

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O3

int MRIStepInnerStepper_GetContent(MRIStepInnerStepper stepper,void **content)

{
  int iVar1;
  
  if (stepper == (MRIStepInnerStepper)0x0) {
    iVar1 = -0x16;
    arkProcessError((ARKodeMem)0x0,-0x16,0x10e0,"MRIStepInnerStepper_GetContent",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                    ,"Inner stepper memory is NULL");
  }
  else {
    *content = stepper->content;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int MRIStepInnerStepper_GetContent(MRIStepInnerStepper stepper, void** content)
{
  if (stepper == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Inner stepper memory is NULL");
    return ARK_ILL_INPUT;
  }
  *content = stepper->content;

  return ARK_SUCCESS;
}